

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::FdConnectionReceiver::FdConnectionReceiver
          (FdConnectionReceiver *this,LowLevelAsyncIoProvider *lowLevel,UnixEventPort *eventPort,
          int fd,NetworkFilter *filter,uint flags)

{
  uint flags_local;
  NetworkFilter *filter_local;
  int fd_local;
  UnixEventPort *eventPort_local;
  LowLevelAsyncIoProvider *lowLevel_local;
  FdConnectionReceiver *this_local;
  
  ConnectionReceiver::ConnectionReceiver(&this->super_ConnectionReceiver);
  OwnedFileDescriptor::OwnedFileDescriptor(&this->super_OwnedFileDescriptor,fd,flags);
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)&PTR_accept_00c130d8;
  this->lowLevel = lowLevel;
  this->eventPort = eventPort;
  this->filter = filter;
  UnixEventPort::FdObserver::FdObserver(&this->observer,eventPort,fd,1);
  return;
}

Assistant:

FdConnectionReceiver(LowLevelAsyncIoProvider& lowLevel,
                       UnixEventPort& eventPort, int fd,
                       LowLevelAsyncIoProvider::NetworkFilter& filter, uint flags)
      : OwnedFileDescriptor(fd, flags), lowLevel(lowLevel), eventPort(eventPort), filter(filter),
        observer(eventPort, fd, UnixEventPort::FdObserver::OBSERVE_READ) {}